

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
::_find_key<phmap::priv::(anonymous_namespace)::DecomposeType>
          (raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
           *this,DecomposeType *key,size_t hashval)

{
  ctrl_t *pcVar1;
  slot_type *psVar2;
  h2_t hash;
  bool bVar3;
  size_t sVar4;
  DecomposeType *ts;
  uint local_84;
  EqualElement<phmap::priv::(anonymous_namespace)::DecomposeType> local_80;
  uint local_70;
  BitMask<unsigned_int,_16,_0> local_6c;
  uint32_t i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  undefined1 local_40 [8];
  probe_seq<16UL> seq;
  size_t hashval_local;
  DecomposeType *key_local;
  raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
  *this_local;
  
  if (this->ctrl_ != (ctrl_t *)0x0) {
    seq.index_ = hashval;
    probe((probe_seq<16UL> *)local_40,this,hashval);
    while( true ) {
      pcVar1 = this->ctrl_;
      sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40);
      GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)&__range4,pcVar1 + sVar4);
      hash = H2(seq.index_);
      __end4 = GroupSse2Impl::Match((GroupSse2Impl *)&__range4,hash);
      i = (uint32_t)BitMask<unsigned_int,_16,_0>::begin(&__end4);
      local_6c = BitMask<unsigned_int,_16,_0>::end(&__end4);
      while (bVar3 = priv::operator!=((BitMask<unsigned_int,_16,_0> *)&i,&local_6c), bVar3) {
        local_70 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)&i);
        local_80.rhs = key;
        local_80.eq = eq_ref(this);
        psVar2 = this->slots_;
        sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40,(ulong)local_70);
        ts = hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,_void>::
             element<phmap::priv::(anonymous_namespace)::DecomposePolicy>(psVar2 + sVar4);
        bVar3 = hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
                apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EqualElement<phmap::priv::(anonymous_namespace)::DecomposeType>,phmap::priv::(anonymous_namespace)::DecomposeType&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
                          (&local_80,ts);
        if (bVar3) {
          sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40,(ulong)local_70);
          return sVar4;
        }
        BitMask<unsigned_int,_16,_0>::operator++((BitMask<unsigned_int,_16,_0> *)&i);
      }
      local_84 = (uint)GroupSse2Impl::MatchEmpty((GroupSse2Impl *)&__range4);
      bVar3 = BitMask::operator_cast_to_bool((BitMask *)&local_84);
      if (bVar3) break;
      probe_seq<16UL>::next((probe_seq<16UL> *)local_40);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }